

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  byte bVar1;
  int p2;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vdbe *p;
  Parse *pPVar6;
  char *zP4;
  Op *pOVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int local_5c;
  
  p = sqlite3GetVdbe(pParse);
  iVar8 = pParse->nTab;
  p2 = pParse->nLabel + -1;
  pParse->nLabel = p2;
  if (nIncr < 0) {
    sqlite3VdbeAddOp3(p,0x2e,(uint)pFKey->isDeferred,p2,0);
  }
  uVar11 = (ulong)(uint)pFKey->nCol;
  if (0 < pFKey->nCol) {
    lVar10 = 0;
    do {
      sqlite3VdbeAddOp3(p,0x32,aiCol[lVar10] + regData + 1,p2,0);
      lVar10 = lVar10 + 1;
      uVar11 = (ulong)pFKey->nCol;
    } while (lVar10 < (long)uVar11);
  }
  iVar8 = iVar8 + -1;
  if (isIgnore == 0) {
    if (pIdx == (Index *)0x0) {
      if (pParse->nTempReg == '\0') {
        iVar2 = pParse->nMem + 1;
        pParse->nMem = iVar2;
      }
      else {
        bVar1 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar1;
        iVar2 = pParse->aTempReg[bVar1];
      }
      sqlite3VdbeAddOp3(p,0x4f,regData + *aiCol + 1,iVar2,0);
      iVar5 = sqlite3VdbeAddOp3(p,0xf,iVar2,0,0);
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        sqlite3VdbeAddOp3(p,0x35,regData,p2,iVar2);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 0x90;
        }
      }
      sqlite3OpenTable(pParse,iVar8,iDb,pTab,0x6c);
      sqlite3VdbeAddOp3(p,0x1f,iVar8,0,iVar2);
      sqlite3VdbeAddOp3(p,0xb,0,p2,0);
      iVar4 = p->nOp;
      if (p->db->mallocFailed == '\0') {
        p->aOp[(int)((iVar4 < 2 | 0xfffffffe) + iVar4)].p2 = iVar4;
        iVar3 = iVar4 + -1;
        if (-1 < iVar5) {
          iVar3 = iVar5;
        }
        pOVar7 = p->aOp + iVar3;
      }
      else {
        pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
        DAT_00210a70 = iVar4;
      }
      pOVar7->p2 = iVar4;
      if (iVar2 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar2;
        }
      }
    }
    else {
      iVar5 = (int)uVar11;
      iVar2 = sqlite3GetTempRange(pParse,iVar5);
      if (pParse->nTempReg == '\0') {
        local_5c = pParse->nMem + 1;
        pParse->nMem = local_5c;
      }
      else {
        bVar1 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar1;
        local_5c = pParse->aTempReg[bVar1];
      }
      sqlite3VdbeAddOp3(p,0x6c,iVar8,pIdx->tnum,iDb);
      sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
      if (0 < iVar5) {
        uVar9 = 0;
        do {
          sqlite3VdbeAddOp3(p,0x4e,aiCol[uVar9] + regData + 1,iVar2 + (int)uVar9,0);
          uVar9 = uVar9 + 1;
        } while ((uVar11 & 0xffffffff) != uVar9);
      }
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        if (0 < iVar5) {
          iVar4 = p->nOp;
          uVar9 = 0;
          do {
            iVar3 = 0;
            if (pIdx->aiColumn[uVar9] != pTab->iPKey) {
              iVar3 = pIdx->aiColumn[uVar9] + 1;
            }
            sqlite3VdbeAddOp3(p,0x34,aiCol[uVar9] + regData + 1,iVar4 + iVar5 + 1,iVar3 + regData);
            if (0 < (long)p->nOp) {
              p->aOp[(long)p->nOp + -1].p5 = 0x10;
            }
            uVar9 = uVar9 + 1;
          } while ((uVar11 & 0xffffffff) != uVar9);
        }
        sqlite3VdbeAddOp3(p,0xb,0,p2,0);
      }
      zP4 = sqlite3IndexAffinityStr(pParse->db,pIdx);
      iVar4 = sqlite3VdbeAddOp3(p,0x5c,iVar2,iVar5,local_5c);
      sqlite3VdbeChangeP4(p,iVar4,zP4,iVar5);
      iVar4 = sqlite3VdbeAddOp3(p,0x1d,iVar8,p2,local_5c);
      if (p->db->mallocFailed == '\0') {
        pOVar7 = p->aOp;
        pOVar7[iVar4].p4type = -3;
        pOVar7[iVar4].p4.i = 0;
      }
      if (local_5c != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = local_5c;
        }
      }
      if (iVar5 == 1) {
        if (iVar2 != 0) {
          bVar1 = pParse->nTempReg;
          if ((ulong)bVar1 < 8) {
            pParse->nTempReg = bVar1 + 1;
            pParse->aTempReg[bVar1] = iVar2;
          }
        }
      }
      else if (pParse->nRangeReg < iVar5) {
        pParse->nRangeReg = iVar5;
        pParse->iRangeReg = iVar2;
      }
    }
  }
  bVar1 = pFKey->isDeferred;
  if ((((bVar1 == 0) && ((pParse->db->flags & 0x80000) == 0)) && (pParse->pToplevel == (Parse *)0x0)
      ) && (pParse->isMultiWrite == '\0')) {
    sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
  }
  else {
    if (0 < nIncr && bVar1 == 0) {
      pPVar6 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar6 = pParse;
      }
      pPVar6->mayAbort = '\x01';
    }
    sqlite3VdbeAddOp3(p,0x96,(uint)bVar1,nIncr,0);
  }
  sqlite3VdbeResolveLabel(p,p2);
  sqlite3VdbeAddOp3(p,0x75,iVar8,0,0);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(pParse);   /* jump here if parent key found */

  sqlite3VdbeVerifyAbortable(v,
    (!pFKey->isDeferred
      && !(pParse->db->flags & SQLITE_DeferFKs)
      && !pParse->pToplevel 
      && !pParse->isMultiWrite) ? OE_Abort : OE_Ignore);

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If 
  ** any are, then the constraint is considered satisfied. No need to 
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
    VdbeCoverage(v);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = aiCol[i] + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk); VdbeCoverage(v);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);
  
      /* Invoke MustBeInt to coerce the child key value to an integer (i.e. 
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy, aiCol[0]+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
      VdbeCoverage(v);
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      }
  
      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp); VdbeCoverage(v);
      sqlite3VdbeGoto(v, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);
      int regRec = sqlite3GetTempReg(pParse);
  
      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy, aiCol[i]+1+regData, regTemp+i);
      }
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter. 
      **
      ** If any of the parent-key values are NULL, then the row cannot match 
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = aiCol[i]+1+regData;
          int iParent = pIdx->aiColumn[i]+1+regData;
          assert( pIdx->aiColumn[i]>=0 );
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent); VdbeCoverage(v);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeGoto(v, iOk);
      }
  
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regTemp, nCol, regRec,
                        sqlite3IndexAffinityStr(pParse->db,pIdx), nCol);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regRec, 0); VdbeCoverage(v);
  
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !(pParse->db->flags & SQLITE_DeferFKs)
   && !pParse->pToplevel 
   && !pParse->isMultiWrite 
  ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3MayAbort(pParse);
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}